

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

bool createdir(char *path)

{
  int iVar1;
  size_t len_00;
  size_t len;
  char *path_local;
  
  len_00 = strlen(path);
  len = (size_t)path;
  if (path[len_00 - 1] == '/') {
    len = (size_t)copystring(createdir::strip,path,len_00);
  }
  iVar1 = mkdir((char *)len,0x1ff);
  return iVar1 == 0;
}

Assistant:

bool createdir(const char *path)
{
    size_t len = strlen(path);
    if(path[len-1]==PATHDIV)
    {
        static string strip;
        path = copystring(strip, path, len);
    }
#ifdef WIN32
    return CreateDirectory(path, NULL)!=0;
#else
    return mkdir(path, 0777)==0;
#endif
}